

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Ptr_t * Llb_Nonlin4Multiply(DdManager *dd,DdNode *bCube,Vec_Ptr_t *vParts)

{
  Vec_Ptr_t *p;
  DdNode *pDVar1;
  int i;
  
  p = Vec_PtrAlloc(vParts->nSize);
  for (i = 0; i < vParts->nSize; i = i + 1) {
    pDVar1 = (DdNode *)Vec_PtrEntry(vParts,i);
    pDVar1 = Cudd_bddAnd(dd,pDVar1,bCube);
    Cudd_Ref(pDVar1);
    Vec_PtrPush(p,pDVar1);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Multiply( DdManager * dd, DdNode * bCube, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vNew;
    DdNode * bTemp, * bFunc;
    int i;
    vNew = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
    {
        bTemp = Cudd_bddAnd( dd, bFunc, bCube );  Cudd_Ref( bTemp );
        Vec_PtrPush( vNew, bTemp );
    }
    return vNew;
}